

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_31;
  undefined1 local_30 [8];
  string type;
  cmCTestCurl *this_local;
  
  type.field_2._8_8_ = this;
  pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY");
    std::__cxx11::string::operator=((string *)&this->HTTPProxy,pcVar2);
    pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)&this->HTTPProxy,":");
      pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
      std::__cxx11::string::operator+=((string *)&this->HTTPProxy,pcVar2);
    }
    pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
    if (pcVar2 != (char *)0x0) {
      this->HTTPProxyType = CURLPROXY_HTTP;
      pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_30,pcVar2,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"HTTP");
      if (bVar1) {
        this->HTTPProxyType = CURLPROXY_HTTP;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"SOCKS4");
        if (bVar1) {
          this->HTTPProxyType = CURLPROXY_SOCKS4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"SOCKS5");
          if (bVar1) {
            this->HTTPProxyType = CURLPROXY_SOCKS5;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_30);
    }
    pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
    if (pcVar2 != (char *)0x0) {
      pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
      std::__cxx11::string::operator=((string *)&this->HTTPProxyAuth,pcVar2);
    }
    pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,":");
      pcVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
      std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,pcVar2);
    }
  }
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  if ( cmSystemTools::GetEnv("HTTP_PROXY") )
    {
    this->HTTPProxy = cmSystemTools::GetEnv("HTTP_PROXY");
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PORT") )
      {
      this->HTTPProxy += ":";
      this->HTTPProxy += cmSystemTools::GetEnv("HTTP_PROXY_PORT");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_TYPE") )
      {
      // this is the default
      this->HTTPProxyType = CURLPROXY_HTTP;
      std::string type = cmSystemTools::GetEnv("HTTP_PROXY_TYPE");
      // HTTP/SOCKS4/SOCKS5
      if ( type == "HTTP" )
        {
        this->HTTPProxyType = CURLPROXY_HTTP;
        }
      else if ( type == "SOCKS4" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
        }
      else if ( type == "SOCKS5" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
        }
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_USER") )
      {
      this->HTTPProxyAuth = cmSystemTools::GetEnv("HTTP_PROXY_USER");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PASSWD") )
      {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += cmSystemTools::GetEnv("HTTP_PROXY_PASSWD");
      }
    }
}